

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

bool __thiscall duckdb::UpdateSegment::HasUncommittedUpdates(UpdateSegment *this,idx_t vector_index)

{
  data_ptr_t pdVar1;
  StorageLockKey *pSVar2;
  bool bVar3;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> read_lock;
  UndoBufferPointer entry;
  UndoBufferReference pin;
  undefined1 auStack_58 [8];
  UndoBufferPointer local_50;
  UndoBufferReference local_40;
  
  pSVar2 = (StorageLockKey *)&this->lock;
  StorageLock::GetSharedLock((StorageLock *)auStack_58);
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::operator*
            ((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
              *)auStack_58);
  local_50 = GetUpdateNode(this,pSVar2,vector_index);
  if (local_50.entry == (UndoBufferEntry *)0x0) {
    bVar3 = false;
  }
  else {
    UndoBufferPointer::Pin(&local_40,&local_50);
    pdVar1 = UndoBufferReference::Ptr(&local_40);
    bVar3 = *(long *)(pdVar1 + 0x38) != 0;
    BufferHandle::~BufferHandle(&local_40.handle);
  }
  ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  ~unique_ptr((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
              auStack_58);
  return bVar3;
}

Assistant:

bool UpdateSegment::HasUncommittedUpdates(idx_t vector_index) {
	auto read_lock = lock.GetSharedLock();
	auto entry = GetUpdateNode(*read_lock, vector_index);
	if (!entry.IsSet()) {
		return false;
	}
	auto pin = entry.Pin();
	auto &info = UpdateInfo::Get(pin);
	if (info.HasNext()) {
		return true;
	}
	return false;
}